

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.h
# Opt level: O0

void __thiscall
Fixpp::result::
Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fixpp::ErrorKind>
::Result(Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fixpp::ErrorKind>
         *this,Err<Fixpp::ErrorKind> *err)

{
  Err<Fixpp::ErrorKind> local_48;
  Err<Fixpp::ErrorKind> *local_18;
  Err<Fixpp::ErrorKind> *err_local;
  Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fixpp::ErrorKind>
  *this_local;
  
  this->ok_ = false;
  local_18 = err;
  err_local = (Err<Fixpp::ErrorKind> *)this;
  details::
  Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fixpp::ErrorKind>
  ::Storage(&this->storage_);
  types::Err<Fixpp::ErrorKind>::Err(&local_48,err);
  details::
  Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fixpp::ErrorKind>
  ::construct(&this->storage_,&local_48);
  types::Err<Fixpp::ErrorKind>::~Err(&local_48);
  return;
}

Assistant:

Result(types::Err<E> err)
        : ok_(false)
    {
        storage_.construct(std::move(err));
    }